

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O2

int cuddWindowReorder(DdManager *table,int low,int high,Cudd_ReorderingType submethod)

{
  undefined4 *puVar1;
  bool bVar2;
  bool bVar3;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  switch(submethod) {
  case CUDD_REORDER_WINDOW2:
    iVar10 = ddWindow2(table,low,high);
    return iVar10;
  case CUDD_REORDER_WINDOW4:
    if (2 < high - low) {
      do {
        if (high <= low + 2) {
          return 1;
        }
        iVar10 = ddPermuteWindow4(table,low);
        low = low + 1;
      } while (iVar10 != 0);
      return 0;
    }
  case CUDD_REORDER_WINDOW3:
    iVar10 = ddWindow3(table,low,high);
    return iVar10;
  case CUDD_REORDER_WINDOW2_CONV:
    iVar10 = ddWindowConv2(table,low,high);
    return iVar10;
  case CUDD_REORDER_WINDOW3_CONV:
    goto switchD_006342be_caseD_c;
  case CUDD_REORDER_WINDOW4_CONV:
    iVar10 = high - low;
    if (2 < iVar10) {
      uVar9 = (ulong)(iVar10 - 2);
      __ptr = malloc(uVar9 * 4);
      if (__ptr == (void *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined4 *)((long)__ptr + uVar4 * 4) = 1;
      }
      lVar5 = (long)(iVar10 + -4);
      lVar6 = (long)(iVar10 + -3);
      lVar7 = (long)(iVar10 + -5);
      uVar4 = 0;
      bVar2 = false;
      do {
        while (uVar4 == uVar9) {
          uVar4 = 0;
          bVar3 = !bVar2;
          bVar2 = false;
          if (bVar3) {
            free(__ptr);
            return 1;
          }
        }
        if (*(int *)((long)__ptr + uVar4 * 4) != 0) {
          iVar10 = ddPermuteWindow4(table,low + (int)uVar4);
          if (0x17 < iVar10 - 1U) {
            free(__ptr);
            return 0;
          }
          puVar1 = (undefined4 *)((long)__ptr + uVar4 * 4);
          switch(iVar10) {
          case 1:
            break;
          case 2:
            if ((long)uVar4 < lVar5) {
              puVar1[2] = 1;
            }
            lVar8 = -8;
            bVar2 = true;
            if (1 < uVar4) {
LAB_0063456b:
              bVar2 = true;
              *(undefined4 *)((long)puVar1 + lVar8) = 1;
            }
            break;
          case 3:
          case 5:
          case 10:
            if ((long)uVar4 < lVar5) {
              puVar1[2] = 1;
            }
            if ((long)uVar4 < lVar6) {
              puVar1[1] = 1;
            }
            bVar2 = true;
            if (1 < uVar4) {
              puVar1[-2] = 1;
              lVar8 = -0xc;
              if (uVar4 != 2) goto LAB_0063456b;
            }
            break;
          case 4:
          case 9:
          case 0xe:
            if ((long)uVar4 < lVar7) {
              puVar1[3] = 1;
            }
            if ((long)uVar4 < lVar5) {
              puVar1[2] = 1;
            }
            bVar2 = true;
            if (uVar4 != 0) {
              puVar1[-1] = 1;
              lVar8 = -8;
              if (uVar4 != 1) goto LAB_0063456b;
            }
            break;
          default:
            if ((long)uVar4 < lVar7) {
              puVar1[3] = 1;
            }
            if ((long)uVar4 < lVar5) {
              puVar1[2] = 1;
            }
            if ((long)uVar4 < lVar6) {
              puVar1[1] = 1;
            }
            bVar2 = true;
            if ((uVar4 != 0) && (puVar1[-1] = 1, uVar4 != 1)) {
              puVar1[-2] = 1;
              goto LAB_0063445c;
            }
            break;
          case 7:
            if ((long)uVar4 < lVar6) {
              puVar1[1] = 1;
            }
LAB_0063445c:
            lVar8 = -0xc;
            bVar2 = true;
            if (2 < uVar4) goto LAB_0063456b;
            break;
          case 8:
            if ((long)uVar4 < lVar7) {
              puVar1[3] = 1;
            }
            lVar8 = -4;
            bVar2 = true;
            if (uVar4 != 0) goto LAB_0063456b;
            break;
          case 0xd:
            if ((long)uVar4 < lVar7) {
              puVar1[3] = 1;
            }
            if ((long)uVar4 < lVar6) {
              puVar1[1] = 1;
            }
            bVar2 = true;
            if (uVar4 != 0) {
              puVar1[-1] = 1;
              goto LAB_0063445c;
            }
          }
          *puVar1 = 0;
        }
        uVar4 = uVar4 + 1;
      } while( true );
    }
switchD_006342be_caseD_c:
    iVar10 = ddWindowConv3(table,low,high);
    return iVar10;
  default:
    return 0;
  }
}

Assistant:

int
cuddWindowReorder(
  DdManager * table /* DD table */,
  int low /* lowest index to reorder */,
  int high /* highest index to reorder */,
  Cudd_ReorderingType submethod /* window reordering option */)
{

    int res;
#ifdef DD_DEBUG
    int supposedOpt;
#endif

    switch (submethod) {
    case CUDD_REORDER_WINDOW2:
        res = ddWindow2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3:
        res = ddWindow3(table,low,high);
        break;
    case CUDD_REORDER_WINDOW4:
        res = ddWindow4(table,low,high);
        break;
    case CUDD_REORDER_WINDOW2_CONV:
        res = ddWindowConv2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3_CONV:
        res = ddWindowConv3(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow3(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err, "Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    case CUDD_REORDER_WINDOW4_CONV:
        res = ddWindowConv4(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow4(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err,"Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    default: return(0);
    }

    return(res);

}